

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cc
# Opt level: O0

void xemmai::t_code::f_rethrow(void)

{
  char *__str;
  t_global *a_library;
  unsigned_long uVar1;
  char *pcVar2;
  byte extraout_DL;
  byte in_SIL;
  t_object *ptVar3;
  wstring_view a_message;
  wstring_view a_message_00;
  string_view a_string;
  undefined1 auVar4 [12];
  unsigned_long uStack_e8;
  unsigned_long uStack_e0;
  unsigned_long uStack_d8;
  bool bStack_ca;
  bool bStack_c9;
  t_object *ptStack_c8;
  undefined1 *puStack_c0;
  t_value<xemmai::t_root> *local_b8;
  t_object *local_b0;
  t_object *local_a8;
  t_value<xemmai::t_root> *local_a0;
  int local_94;
  exception_ptr *local_90;
  undefined8 local_88;
  t_rvalue *anon_var_0;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  wstring local_68;
  __sv_type local_48;
  long *local_38;
  exception *e;
  int local_1c;
  t_object *local_18;
  exception_ptr local_10 [8];
  
  local_90 = local_10;
  puStack_c0 = (undefined1 *)0x22c09b;
  std::current_exception();
  puStack_c0 = (undefined1 *)0x22c0a7;
  auVar4 = std::rethrow_exception(local_90);
  local_1c = auVar4._8_4_;
  local_18 = auVar4._0_8_;
  puStack_c0 = (undefined1 *)0x22c0be;
  std::__exception_ptr::exception_ptr::~exception_ptr(local_10);
  local_94 = local_1c;
  uVar1 = 3;
  if (local_1c == 3) {
    puStack_c0 = (undefined1 *)0x22c0d9;
    ptVar3 = local_18;
    local_88 = __cxa_begin_catch();
    puStack_c0 = (undefined1 *)0x22c0e2;
    __cxa_rethrow();
    bStack_c9 = (bool)(in_SIL & 1);
    bStack_ca = (bool)(extraout_DL & 1);
    uStack_d8 = uVar1;
    ptStack_c8 = ptVar3;
    puStack_c0 = &stack0xfffffffffffffff8;
    a_library = f_global();
    f_new<xemmai::t_code,xemmai::t_global,xemmai::t_object*&,bool&,bool&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&>
              (a_library,&ptStack_c8,&bStack_c9,&bStack_ca,&uStack_d8,&uStack_e0,&uStack_e8,
               (unsigned_long *)&local_b0);
    return;
  }
  pcVar2 = (char *)0x2;
  if (local_1c == 2) {
    puStack_c0 = (undefined1 *)0x22c103;
    local_38 = (long *)__cxa_begin_catch(local_18);
    anon_var_0._7_1_ = 1;
    puStack_c0 = (undefined1 *)0x22c115;
    local_a0 = (t_value<xemmai::t_root> *)__cxa_allocate_exception(0x10);
    puStack_c0 = (undefined1 *)0x22c129;
    __str = (char *)(**(code **)(*local_38 + 0x10))();
    puStack_c0 = (undefined1 *)0x22c135;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,__str);
    puStack_c0 = (undefined1 *)0x22c146;
    a_string._M_str = pcVar2;
    a_string._M_len = (size_t)local_78._M_str;
    portable::f_convert_abi_cxx11_(&local_68,(portable *)local_78._M_len,a_string);
    puStack_c0 = (undefined1 *)0x22c151;
    local_48 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_68);
    a_message._M_str = local_48._M_str;
    puStack_c0 = (undefined1 *)0x22c166;
    a_message._M_len = (size_t)a_message._M_str;
    local_a8 = t_throwable::f_instantiate((t_throwable *)local_48._M_len,a_message);
    puStack_c0 = (undefined1 *)0x22c182;
    t_value<xemmai::t_root>::t_slot(local_a0,local_a8);
    anon_var_0._7_1_ = 0;
    puStack_c0 = &LAB_0022c1a2;
    __cxa_throw(local_a0,&t_value<xemmai::t_root>::typeinfo,t_value<xemmai::t_root>::~t_value);
  }
  puStack_c0 = (undefined1 *)0x22c1b0;
  __cxa_begin_catch(local_18);
  puStack_c0 = (undefined1 *)0x22c1ba;
  local_b8 = (t_value<xemmai::t_root> *)__cxa_allocate_exception(0x10);
  puStack_c0 = (undefined1 *)0x22c1d2;
  _e = sv(L"<unknown>.",10);
  a_message_00._M_str = e._8_8_;
  puStack_c0 = (undefined1 *)0x22c1e7;
  a_message_00._M_len = (size_t)a_message_00._M_str;
  local_b0 = t_throwable::f_instantiate((t_throwable *)e,a_message_00);
  puStack_c0 = (undefined1 *)0x22c203;
  t_value<xemmai::t_root>::t_slot(local_b8,local_b0);
  puStack_c0 = &LAB_0022c21f;
  __cxa_throw(local_b8,&t_value<xemmai::t_root>::typeinfo,t_value<xemmai::t_root>::~t_value);
}

Assistant:

void t_code::f_rethrow()
{
	try {
		std::rethrow_exception(std::current_exception());
	} catch (const t_rvalue&) {
		throw;
	} catch (std::exception& e) {
		throw t_rvalue(t_throwable::f_instantiate(portable::f_convert(e.what())));
	} catch (...) {
		throw t_rvalue(t_throwable::f_instantiate(L"<unknown>."sv));
	}
}